

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::SourceCodeInfo::SerializeWithCachedSizesToArray
          (SourceCodeInfo *this,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  SourceCodeInfo_Location *this_00;
  uint8 *target_00;
  UnknownFieldSet *pUVar4;
  int local_5c;
  byte *pbStack_58;
  int i;
  uint8 *target_local;
  SourceCodeInfo *this_local;
  byte *local_10;
  
  local_5c = 0;
  pbStack_58 = target;
  while( true ) {
    iVar2 = location_size(this);
    if (iVar2 <= local_5c) break;
    this_00 = location(this,local_5c);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_58 = (byte)uVar3;
      local_10 = pbStack_58 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_58 = (byte)uVar3 | 0x80;
      pbStack_58[1] = (byte)(uVar3 >> 7);
      local_10 = pbStack_58 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_58);
    }
    uVar3 = SourceCodeInfo_Location::GetCachedSize(this_00);
    target_00 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    pbStack_58 = SourceCodeInfo_Location::SerializeWithCachedSizesToArray(this_00,target_00);
    local_5c = local_5c + 1;
  }
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    pbStack_58 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar4,pbStack_58);
  }
  return pbStack_58;
}

Assistant:

::google::protobuf::uint8* SourceCodeInfo::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
  for (int i = 0; i < this->location_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        1, this->location(i), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}